

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_add_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_gej *b,secp256k1_fe *rzr)

{
  int iVar1;
  secp256k1_fe *in_RCX;
  void *in_RDX;
  void *in_RSI;
  secp256k1_fe *in_RDI;
  secp256k1_fe t;
  secp256k1_fe h3;
  secp256k1_fe h2;
  secp256k1_fe i;
  secp256k1_fe h;
  secp256k1_fe s2;
  secp256k1_fe s1;
  secp256k1_fe u2;
  secp256k1_fe u1;
  secp256k1_fe z12;
  secp256k1_fe z22;
  secp256k1_gej *in_stack_fffffffffffffe28;
  secp256k1_gej *in_stack_fffffffffffffe30;
  secp256k1_fe local_1b0;
  secp256k1_fe local_188;
  secp256k1_fe local_160;
  secp256k1_fe local_138;
  secp256k1_fe local_110;
  secp256k1_fe local_e8;
  secp256k1_fe local_c0;
  secp256k1_fe local_98 [3];
  secp256k1_fe *local_20;
  void *local_18;
  void *local_10;
  secp256k1_fe *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  secp256k1_gej_verify((secp256k1_gej *)0x136b74);
  secp256k1_gej_verify((secp256k1_gej *)0x136b81);
  if (*(int *)((long)local_10 + 0x78) == 0) {
    if (*(int *)((long)local_18 + 0x78) == 0) {
      secp256k1_fe_impl_sqr(&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x);
      secp256k1_fe_impl_sqr(&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x);
      secp256k1_fe_impl_mul
                (&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                 (secp256k1_fe *)0x136c47);
      secp256k1_fe_impl_mul
                (&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                 (secp256k1_fe *)0x136c64);
      secp256k1_fe_impl_mul
                (&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                 (secp256k1_fe *)0x136c85);
      secp256k1_fe_impl_mul
                (&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                 (secp256k1_fe *)0x136ca1);
      secp256k1_fe_impl_mul
                (&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                 (secp256k1_fe *)0x136cc2);
      secp256k1_fe_impl_mul
                (&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                 (secp256k1_fe *)0x136cde);
      secp256k1_fe_impl_negate_unchecked(&local_138,local_98,1);
      secp256k1_fe_impl_add(&local_138,&local_c0);
      secp256k1_fe_impl_negate_unchecked(&local_160,&local_110,1);
      secp256k1_fe_impl_add(&local_160,&local_e8);
      iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_138);
      if (iVar1 == 0) {
        *(undefined4 *)local_8[3].n = 0;
        secp256k1_fe_impl_mul
                  (&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                   (secp256k1_fe *)0x136dcd);
        if (local_20 != (secp256k1_fe *)0x0) {
          memcpy(local_20,&stack0xfffffffffffffe28,0x28);
        }
        secp256k1_fe_impl_mul
                  (&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                   (secp256k1_fe *)0x136e0d);
        secp256k1_fe_impl_sqr(&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x);
        secp256k1_fe_impl_negate_unchecked(&local_188,&local_188,1);
        secp256k1_fe_impl_mul
                  (&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                   (secp256k1_fe *)0x136e48);
        secp256k1_fe_impl_mul
                  (&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                   (secp256k1_fe *)0x136e5d);
        secp256k1_fe_impl_sqr(&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x);
        secp256k1_fe_impl_add(local_8,&local_1b0);
        secp256k1_fe_impl_add(local_8,(secp256k1_fe *)&stack0xfffffffffffffe28);
        secp256k1_fe_impl_add(local_8,(secp256k1_fe *)&stack0xfffffffffffffe28);
        secp256k1_fe_impl_add((secp256k1_fe *)&stack0xfffffffffffffe28,local_8);
        secp256k1_fe_impl_mul
                  (&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                   (secp256k1_fe *)0x136eca);
        secp256k1_fe_impl_mul
                  (&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                   (secp256k1_fe *)0x136edf);
        secp256k1_fe_impl_add(local_8 + 1,&local_1b0);
        secp256k1_gej_verify((secp256k1_gej *)0x136f02);
      }
      else {
        iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_160);
        if (iVar1 == 0) {
          if (local_20 != (secp256k1_fe *)0x0) {
            secp256k1_fe_impl_set_int(local_20,0);
          }
          secp256k1_gej_set_infinity((secp256k1_gej *)0x136d9d);
        }
        else {
          secp256k1_gej_double_var
                    (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(secp256k1_fe *)0x136d74);
        }
      }
    }
    else {
      if (local_20 != (secp256k1_fe *)0x0) {
        secp256k1_fe_impl_set_int(local_20,1);
      }
      memcpy(local_8,local_10,0x80);
    }
  }
  else {
    memcpy(local_8,local_18,0x80);
  }
  return;
}

Assistant:

static void secp256k1_gej_add_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_gej *b, secp256k1_fe *rzr) {
    /* 12 mul, 4 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe z22, z12, u1, u2, s1, s2, h, i, h2, h3, t;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GEJ_VERIFY(b);

    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        *r = *b;
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    secp256k1_fe_sqr(&z22, &b->z);
    secp256k1_fe_sqr(&z12, &a->z);
    secp256k1_fe_mul(&u1, &a->x, &z22);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    secp256k1_fe_mul(&s1, &a->y, &z22); secp256k1_fe_mul(&s1, &s1, &b->z);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    secp256k1_fe_mul(&t, &h, &b->z);
    if (rzr != NULL) {
        *rzr = t;
    }
    secp256k1_fe_mul(&r->z, &a->z, &t);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);

    SECP256K1_GEJ_VERIFY(r);
}